

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::compile_abi_cxx11_(string *__return_storage_ptr__,CompilerGLSL *this)

{
  uint uVar1;
  bool bVar2;
  ExecutionModel model;
  SPIRFunction *func;
  SPIREntryPoint *pSVar3;
  uint uVar4;
  uint32_t iteration_count;
  undefined1 uVar5;
  bool bVar6;
  Bitset local_78;
  
  ParsedIR::fixup_reserved_names(&(this->super_Compiler).ir);
  bVar2 = (this->options).vulkan_semantics;
  if (bVar2 == false) {
    (this->backend).nonuniform_qualifier = "";
    (this->backend).needs_row_major_load_workaround =
         (this->options).enable_row_major_load_workaround;
  }
  uVar1 = (this->options).version;
  uVar4._0_1_ = (this->options).es;
  uVar4._1_1_ = (this->options).force_temporary;
  uVar4._2_2_ = *(undefined2 *)&(this->options).field_0x6;
  uVar5 = (undefined1)uVar4;
  if (bVar2 != false) {
    uVar5 = true;
  }
  (this->backend).allow_precision_qualifiers = (bool)uVar5;
  (this->backend).force_gl_in_out_block = true;
  (this->backend).supports_extensions = true;
  (this->backend).use_array_constructor = true;
  (this->backend).workgroup_size_is_hidden = true;
  bVar6 = (uVar4 & 1) != 0;
  if (bVar6) {
    bVar2 = true;
  }
  (this->backend).requires_relaxed_precision_analysis = bVar2;
  uVar4 = 399;
  if (bVar6) {
    uVar4 = 0x13f;
  }
  (this->backend).support_precise_qualifier = uVar4 < uVar1;
  ::std::__cxx11::string::assign((char *)&(this->backend).constant_null_initializer);
  (this->backend).requires_matching_array_initializer = true;
  if (((this->options).es == true) && ((this->options).version < 300)) {
    (this->backend).support_case_fallthrough = false;
  }
  fixup_anonymous_struct_names(this);
  fixup_type_alias(this);
  reorder_type_alias(this);
  Compiler::build_function_control_flow_graphs_and_analyze(&this->super_Compiler);
  find_static_extensions(this);
  fixup_image_load_store_access(this);
  Compiler::update_active_builtins(&this->super_Compiler);
  Compiler::analyze_image_and_sampler_usage(&this->super_Compiler);
  Compiler::analyze_interlocked_resource_usage(&this->super_Compiler);
  if ((this->inout_color_attachments).
      super__Vector_base<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->inout_color_attachments).
      super__Vector_base<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    emit_inout_fragment_outputs_copy_to_subpass_inputs(this);
  }
  if ((this->super_Compiler).ir.addressing_model == AddressingModelPhysicalStorageBuffer64) {
    Compiler::analyze_non_block_pointer_types(&this->super_Compiler);
  }
  iteration_count = 0;
  do {
    reset(this,iteration_count);
    StringStream<4096UL,_4096UL>::reset(&this->buffer);
    (*(this->super_Compiler)._vptr_Compiler[0xe])(this);
    emit_resources(this);
    model = Compiler::get_execution_model(&this->super_Compiler);
    emit_extension_workarounds(this,model);
    if (this->required_polyfills != 0) {
      emit_polyfills(this,this->required_polyfills,false);
    }
    if ((((this->options).es != false) || ((this->options).vulkan_semantics == true)) &&
       (this->required_polyfills_relaxed != 0)) {
      emit_polyfills(this,this->required_polyfills_relaxed,true);
    }
    func = Compiler::get<spirv_cross::SPIRFunction>
                     (&this->super_Compiler,(this->super_Compiler).ir.default_entry_point.id);
    local_78.lower = 0;
    local_78.higher._M_h._M_bucket_count = 1;
    local_78.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_78.higher._M_h._M_element_count = 0;
    local_78.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_78.higher._M_h._M_rehash_policy._4_4_ = 0;
    local_78.higher._M_h._M_rehash_policy._M_next_resize = 0;
    local_78.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_78.higher._M_h._M_buckets = &local_78.higher._M_h._M_single_bucket;
    emit_function(this,func,&local_78);
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_78.higher._M_h);
    iteration_count = iteration_count + 1;
    bVar2 = Compiler::is_forcing_recompilation(&this->super_Compiler);
  } while (bVar2);
  if ((this->super_Compiler).interlocked_is_complex == true) {
    statement<char_const(&)[12]>(this,(char (*) [12])"void main()");
    begin_scope(this);
    statement<char_const(&)[78]>
              (this,(char (*) [78])
                    "// Interlocks were used in a way not compatible with GLSL, this is very slow.")
    ;
    statement<char_const(&)[40]>(this,(char (*) [40])"SPIRV_Cross_beginInvocationInterlock();");
    statement<char_const(&)[26]>(this,(char (*) [26])"spvMainInterlockedBody();");
    statement<char_const(&)[38]>(this,(char (*) [38])"SPIRV_Cross_endInvocationInterlock();");
    end_scope(this);
  }
  pSVar3 = Compiler::get_entry_point(&this->super_Compiler);
  ::std::__cxx11::string::assign((char *)&pSVar3->name);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)&this->buffer);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::compile()
{
	ir.fixup_reserved_names();

	if (!options.vulkan_semantics)
	{
		// only NV_gpu_shader5 supports divergent indexing on OpenGL, and it does so without extra qualifiers
		backend.nonuniform_qualifier = "";
		backend.needs_row_major_load_workaround = options.enable_row_major_load_workaround;
	}
	backend.allow_precision_qualifiers = options.vulkan_semantics || options.es;
	backend.force_gl_in_out_block = true;
	backend.supports_extensions = true;
	backend.use_array_constructor = true;
	backend.workgroup_size_is_hidden = true;
	backend.requires_relaxed_precision_analysis = options.es || options.vulkan_semantics;
	backend.support_precise_qualifier =
			(!options.es && options.version >= 400) || (options.es && options.version >= 320);
	backend.constant_null_initializer = "{ }";
	backend.requires_matching_array_initializer = true;

	if (is_legacy_es())
		backend.support_case_fallthrough = false;

	// Scan the SPIR-V to find trivial uses of extensions.
	fixup_anonymous_struct_names();
	fixup_type_alias();
	reorder_type_alias();
	build_function_control_flow_graphs_and_analyze();
	find_static_extensions();
	fixup_image_load_store_access();
	update_active_builtins();
	analyze_image_and_sampler_usage();
	analyze_interlocked_resource_usage();
	if (!inout_color_attachments.empty())
		emit_inout_fragment_outputs_copy_to_subpass_inputs();

	// Shaders might cast unrelated data to pointers of non-block types.
	// Find all such instances and make sure we can cast the pointers to a synthesized block type.
	if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
		analyze_non_block_pointer_types();

	uint32_t pass_count = 0;
	do
	{
		reset(pass_count);

		buffer.reset();

		emit_header();
		emit_resources();
		emit_extension_workarounds(get_execution_model());

		if (required_polyfills != 0)
			emit_polyfills(required_polyfills, false);
		if ((options.es || options.vulkan_semantics) && required_polyfills_relaxed != 0)
			emit_polyfills(required_polyfills_relaxed, true);

		emit_function(get<SPIRFunction>(ir.default_entry_point), Bitset());

		pass_count++;
	} while (is_forcing_recompilation());

	// Implement the interlocked wrapper function at the end.
	// The body was implemented in lieu of main().
	if (interlocked_is_complex)
	{
		statement("void main()");
		begin_scope();
		statement("// Interlocks were used in a way not compatible with GLSL, this is very slow.");
		statement("SPIRV_Cross_beginInvocationInterlock();");
		statement("spvMainInterlockedBody();");
		statement("SPIRV_Cross_endInvocationInterlock();");
		end_scope();
	}

	// Entry point in GLSL is always main().
	get_entry_point().name = "main";

	return buffer.str();
}